

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::vacuum(StackIROptimizer *this)

{
  uint uVar1;
  pointer ppSVar2;
  ulong uVar3;
  
  ppSVar2 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    uVar1 = 1;
    uVar3 = 0;
    do {
      if ((ppSVar2[uVar3] != (StackInst *)0x0) && (ppSVar2[uVar3]->origin->_id == NopId)) {
        ppSVar2[uVar3] = (StackInst *)0x0;
      }
      uVar3 = (ulong)uVar1;
      ppSVar2 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar1 = uVar1 + 1;
    } while (uVar3 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3)
            );
  }
  return;
}

Assistant:

void StackIROptimizer::vacuum() {
  // In the wasm binary format a nop is never needed. (In Binaryen IR, in
  // comparison, it is necessary e.g. in a function body or an if arm.)
  //
  // It is especially important to remove nops because we add nops when we
  // read wasm into Binaryen IR. That is, this avoids a potential increase in
  // code size.
  for (Index i = 0; i < insts.size(); i++) {
    auto*& inst = insts[i];
    if (inst && inst->origin->is<Nop>()) {
      inst = nullptr;
    }
  }
}